

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityDamageStatusPdu.cpp
# Opt level: O3

void __thiscall DIS::EntityDamageStatusPdu::EntityDamageStatusPdu(EntityDamageStatusPdu *this)

{
  WarfareFamilyPdu::WarfareFamilyPdu(&this->super_WarfareFamilyPdu);
  (this->super_WarfareFamilyPdu).super_Pdu.super_PduSuperclass._vptr_PduSuperclass =
       (_func_int **)&PTR__EntityDamageStatusPdu_001b4560;
  EntityID::EntityID(&this->_damagedEntityID);
  this->_padding1 = 0;
  this->_padding2 = 0;
  this->_numberOfDamageDescription = 0;
  (this->_damageDescriptionRecords).
  super__Vector_base<DIS::DirectedEnergyDamage,_std::allocator<DIS::DirectedEnergyDamage>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_damageDescriptionRecords).
  super__Vector_base<DIS::DirectedEnergyDamage,_std::allocator<DIS::DirectedEnergyDamage>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_damageDescriptionRecords).
  super__Vector_base<DIS::DirectedEnergyDamage,_std::allocator<DIS::DirectedEnergyDamage>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  PduSuperclass::setPduType((PduSuperclass *)this,'E');
  return;
}

Assistant:

EntityDamageStatusPdu::EntityDamageStatusPdu() : WarfareFamilyPdu(),
   _damagedEntityID(), 
   _padding1(0), 
   _padding2(0), 
   _numberOfDamageDescription(0)
{
    setPduType( 69 );
}